

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_queue.c
# Opt level: O1

int setOption(void *handle,char *name,void *value)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  char *pcVar4;
  
  if ((name == (char *)0x0 || handle == (void *)0x0) || value == (void *)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x27e;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x27e;
    }
    pcVar4 = "invalid argument (handle=%p, name=%p, value=%p)";
    iVar3 = 0x27d;
  }
  else {
    iVar1 = strcmp("SAVED_OPTION_MAX_ENQUEUE_TIME_SECS",name);
    if (iVar1 == 0) {
      iVar1 = message_queue_set_max_message_enqueued_time_secs((MESSAGE_QUEUE_HANDLE)handle,*value);
      if (iVar1 == 0) {
        return 0;
      }
      p_Var2 = xlogging_get_log_function();
      iVar1 = 0x285;
      if (p_Var2 == (LOGGER_LOG)0x0) {
        return 0x285;
      }
      pcVar4 = "failed setting option %s";
      iVar3 = 0x284;
      handle = name;
    }
    else {
      iVar1 = strcmp("SAVED_OPTION_MAX_PROCESSING_TIME_SECS",name);
      if (iVar1 == 0) {
        iVar1 = message_queue_set_max_message_processing_time_secs
                          ((MESSAGE_QUEUE_HANDLE)handle,*value);
        if (iVar1 == 0) {
          return 0;
        }
        p_Var2 = xlogging_get_log_function();
        iVar1 = 0x291;
        if (p_Var2 == (LOGGER_LOG)0x0) {
          return 0x291;
        }
        pcVar4 = "failed setting option %s";
        iVar3 = 0x290;
        handle = name;
      }
      else {
        iVar1 = strcmp("SAVED_OPTION_MAX_RETRY_COUNT",name);
        if (iVar1 == 0) {
          iVar1 = message_queue_set_max_retry_count((MESSAGE_QUEUE_HANDLE)handle,*value);
          if (iVar1 == 0) {
            return 0;
          }
          p_Var2 = xlogging_get_log_function();
          iVar1 = 0x29d;
          if (p_Var2 == (LOGGER_LOG)0x0) {
            return 0x29d;
          }
          pcVar4 = "failed setting option %s";
          iVar3 = 0x29c;
          handle = name;
        }
        else {
          p_Var2 = xlogging_get_log_function();
          iVar1 = 0x2a7;
          if (p_Var2 == (LOGGER_LOG)0x0) {
            return 0x2a7;
          }
          pcVar4 = "option %s is invalid";
          iVar3 = 0x2a6;
          handle = name;
        }
      }
    }
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/message_queue.c"
            ,"setOption",iVar3,1,pcVar4,handle);
  return iVar1;
}

Assistant:

static int setOption(void* handle, const char* name, const void* value)
{
    int result;

    if (handle == NULL || name == NULL || value == NULL)
    {
        LogError("invalid argument (handle=%p, name=%p, value=%p)", handle, name, value);
        result = MU_FAILURE;
    }
    else if (strcmp(SAVED_OPTION_MAX_ENQUEUE_TIME_SECS, name) == 0)
    {
        if (message_queue_set_max_message_enqueued_time_secs((MESSAGE_QUEUE_HANDLE)handle, *(size_t*)value) != RESULT_OK)
        {
            LogError("failed setting option %s", name);
            result = MU_FAILURE;
        }
        else
        {
            result = RESULT_OK;
        }
    }
    else if (strcmp(SAVED_OPTION_MAX_PROCESSING_TIME_SECS, name) == 0)
    {
        if (message_queue_set_max_message_processing_time_secs((MESSAGE_QUEUE_HANDLE)handle, *(size_t*)value) != RESULT_OK)
        {
            LogError("failed setting option %s", name);
            result = MU_FAILURE;
        }
        else
        {
            result = RESULT_OK;
        }
    }
    else if (strcmp(SAVED_OPTION_MAX_RETRY_COUNT, name) == 0)
    {
        if (message_queue_set_max_retry_count((MESSAGE_QUEUE_HANDLE)handle, *(size_t*)value) != RESULT_OK)
        {
            LogError("failed setting option %s", name);
            result = MU_FAILURE;
        }
        else
        {
            result = RESULT_OK;
        }
    }
    else
    {
        LogError("option %s is invalid", name);
        result = MU_FAILURE;
    }

    return result;
}